

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O2

void __thiscall
Diligent::
ShaderVariableBase<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
::SetBufferOffset(ShaderVariableBase<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                  *this,Uint32 Offset,Uint32 ArrayIndex)

{
  PipelineResourceDesc *pPVar1;
  string msg;
  string local_48;
  
  pPVar1 = GetDesc(this);
  if ((pPVar1->Flags & PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS) != PIPELINE_RESOURCE_FLAG_NONE) {
    FormatString<char[113]>
              (&local_48,
               (char (*) [113])
               "SetBufferOffset() is not only allowed for variables created with PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS flag."
              );
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"SetBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x2c2);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if (pPVar1->VarType == SHADER_RESOURCE_VARIABLE_TYPE_STATIC) {
    FormatString<char[55]>
              (&local_48,(char (*) [55])"SetBufferOffset() is not allowed for static variables.");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"SetBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x2c4);
    std::__cxx11::string::~string((string *)&local_48);
  }
  ShaderVariableManagerGL::UniformBuffBindInfo::SetDynamicOffset
            ((UniformBuffBindInfo *)this,ArrayIndex,Offset);
  return;
}

Assistant:

SetBufferOffset(Uint32 Offset,
                                                    Uint32 ArrayIndex) override final
    {
#ifdef DILIGENT_DEVELOPMENT
        {
            const PipelineResourceDesc& Desc = GetDesc();
            DEV_CHECK_ERR((Desc.Flags & PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS) == 0,
                          "SetBufferOffset() is not only allowed for variables created with PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS flag.");
            DEV_CHECK_ERR(Desc.VarType != SHADER_RESOURCE_VARIABLE_TYPE_STATIC,
                          "SetBufferOffset() is not allowed for static variables.");
        }
#endif

        static_cast<ThisImplType*>(this)->SetDynamicOffset(ArrayIndex, Offset);
    }